

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O3

void __thiscall
PeleLM::compute_differential_diffusion_terms
          (PeleLM *this,MultiFab *D,MultiFab *DD,Real time,Real dt,bool include_Wbar_terms)

{
  IntVect *nghost;
  MultiFab *S;
  IntVect *nghost_00;
  MultiFab **flux;
  __uniq_ptr_data<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>,_true,_true> amrlevel;
  TimeLevel TVar1;
  int iVar2;
  long lVar3;
  MultiFab **diffusivity;
  int boxGrow;
  int iVar4;
  Geometry *this_00;
  Periodicity PVar5;
  MultiFab *local_298;
  FluxBoxes fb_diff;
  MFInfo local_268;
  FillPatchIterator S_fpi;
  
  if (hack_nospecdiff != 0) {
    amrex::Error_host("compute_differential_diffusion_terms: hack_nospecdiff not implemented");
  }
  TVar1 = amrex::AmrLevel::which_time((AmrLevel *)this,0,time);
  flux = (&this->SpecDiffusionFluxn)[TVar1 != AmrOldTime];
  iVar2 = std::__cxx11::string::compare((char *)&diffusion_redistribution_type_abi_cxx11_);
  boxGrow = 3;
  if (iVar2 != 0) {
    iVar2 = std::__cxx11::string::compare((char *)&diffusion_redistribution_type_abi_cxx11_);
    boxGrow = (iVar2 == 0) + 2;
  }
  iVar2 = first_spec;
  if (NavierStokesBase::Temp < first_spec) {
    iVar2 = NavierStokesBase::Temp;
  }
  if (2 < iVar2) {
    iVar2 = 3;
  }
  iVar4 = NavierStokesBase::Temp;
  if (NavierStokesBase::Temp < last_spec) {
    iVar4 = last_spec;
  }
  if (iVar4 < 4) {
    iVar4 = 3;
  }
  iVar4 = (iVar4 - iVar2) + 1;
  amrex::FillPatchIterator::FillPatchIterator(&S_fpi,(AmrLevel *)this,D,boxGrow,time,0,iVar2,iVar4);
  lVar3 = (long)(this->super_NavierStokesBase).super_AmrLevel.level;
  if (lVar3 < 1) {
    local_298 = (MultiFab *)0x0;
  }
  else {
    amrlevel.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
    super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
    super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
         (((this->super_NavierStokesBase).super_AmrLevel.parent)->amr_level).
         super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
         .
         super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[lVar3 + -1]._M_t.
         super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
    local_298 = (MultiFab *)operator_new(0x180);
    local_268._1_7_ = 0;
    local_268.alloc = true;
    local_268.arena._0_4_ = 0;
    local_268.arena._4_4_ = 0;
    local_268.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_268.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_268.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    fb_diff.data = (MultiFab **)&PTR__FabFactory_00712918;
    amrex::MultiFab::MultiFab
              (local_298,
               (BoxArray *)
               ((long)amrlevel.
                      super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                      .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0xd8),
               (DistributionMapping *)
               ((long)amrlevel.
                      super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                      .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x140),iVar4,1
               ,&local_268,(FabFactory<amrex::FArrayBox> *)&fb_diff);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_268.tags.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
    amrex::AmrLevel::FillPatch
              ((AmrLevel *)
               amrlevel.
               super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
               super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
               super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,local_298,1,time,0,3,
               iVar4,0);
  }
  fb_diff.data = (MultiFab **)0x0;
  diffusivity = FluxBoxes::define(&fb_diff,(AmrLevel *)this,10,0);
  getDiffusivity(this,diffusivity,time,first_spec,0,9);
  getDiffusivity(this,diffusivity,time,NavierStokesBase::Temp,9,1);
  S = &S_fpi.m_fabs;
  compute_differential_diffusion_fluxes
            (this,S,local_298,flux,diffusivity,dt,time,include_Wbar_terms);
  nghost_00 = &(D->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow;
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&D->super_FabArray<amrex::FArrayBox>,0.0,0,
             (D->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp,nghost_00);
  nghost = &(DD->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow;
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&DD->super_FabArray<amrex::FArrayBox>,0.0,0,
             (DD->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp,nghost);
  flux_divergenceRD(this,S,(int)((long)first_spec + -3),D,0,flux,0,9,
                    (this->super_NavierStokesBase).m_bcrec_scalars_d.m_data + (long)first_spec + -3,
                    -1.0,dt,1);
  flux_divergenceRD(this,S,(int)((long)NavierStokesBase::Temp + -3),D,10,flux,0xb,1,
                    (this->super_NavierStokesBase).m_bcrec_scalars_d.m_data +
                    (long)NavierStokesBase::Temp + -3,-1.0,dt,0);
  flux_divergenceRD(this,S,(int)((long)RhoH + -3),DD,0,flux,10,1,
                    (this->super_NavierStokesBase).m_bcrec_scalars_d.m_data + (long)RhoH + -3,-1.0,
                    dt,0);
  if ((0 < nghost_00->vect[0]) && (0 < nghost->vect[0])) {
    this_00 = &(this->super_NavierStokesBase).super_AmrLevel.geom;
    PVar5 = amrex::Geometry::periodicity(this_00);
    local_268.alloc = PVar5.period.vect[0]._0_1_;
    local_268._1_7_ = PVar5.period.vect._1_7_;
    local_268.arena._0_4_ = PVar5.period.vect[2];
    amrex::FabArray<amrex::FArrayBox>::FillBoundary<double>
              (&D->super_FabArray<amrex::FArrayBox>,0,0xb,(Periodicity *)&local_268,false);
    PVar5 = amrex::Geometry::periodicity(this_00);
    local_268.alloc = PVar5.period.vect[0]._0_1_;
    local_268._1_7_ = PVar5.period.vect._1_7_;
    local_268.arena._0_4_ = PVar5.period.vect[2];
    amrex::FabArray<amrex::FArrayBox>::FillBoundary<double>
              (&DD->super_FabArray<amrex::FArrayBox>,0,1,(Periodicity *)&local_268,false);
    amrex::Extrapolater::FirstOrderExtrap
              (D,this_00,0,0xb,
               (D->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0]);
    amrex::Extrapolater::FirstOrderExtrap
              (DD,this_00,0,1,
               (DD->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0]);
  }
  FluxBoxes::clear(&fb_diff);
  if (local_298 != (MultiFab *)0x0) {
    (*(local_298->super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase[1])
              (local_298);
  }
  amrex::FillPatchIterator::~FillPatchIterator(&S_fpi);
  return;
}

Assistant:

void
PeleLM::compute_differential_diffusion_terms (MultiFab& D,
                                              MultiFab& DD,
                                              Real      time,
                                              Real      dt,
                                              bool      include_Wbar_terms)
{
   BL_PROFILE("PLM::compute_differential_diffusion_terms()");
   //
   // Sets vt for species, RhoH and Temp together
   // Uses state at time to explicitly compute fluxes, and resets internal
   //  data for fluxes, etc
   //
   AMREX_ASSERT(D.boxArray() == grids);
   AMREX_ASSERT(D.nComp() >= NUM_SPECIES+2); // room for spec+RhoH+Temp

   if (hack_nospecdiff)
   {
     amrex::Error("compute_differential_diffusion_terms: hack_nospecdiff not implemented");
   }

   const TimeLevel whichTime = which_time(State_Type,time);
   AMREX_ASSERT(whichTime == AmrOldTime || whichTime == AmrNewTime);
   MultiFab* const * flux = (whichTime == AmrOldTime) ? SpecDiffusionFluxn : SpecDiffusionFluxnp1;

   // Get scalars with proper ghost cells. Might need more than what's available in the class
   // data, so use an FPI.
   int nGrowDiff = 1;
#ifdef AMREX_USE_EB
   if ( diffusion_redistribution_type == "StateRedist" ||
        diffusion_redistribution_type == "NewStateRedist" ) {
       nGrowDiff = 3;
   } else {
       nGrowDiff = 2;
   }
#endif

   int sComp = std::min((int)Density, std::min((int)first_spec,(int)Temp) );
   int eComp = std::max((int)Density, std::max((int)last_spec,(int)Temp) );
   int nComp = eComp - sComp + 1;
   FillPatchIterator S_fpi(*this, D, nGrowDiff, time, State_Type, sComp, nComp);
   MultiFab& scalars = S_fpi.get_mf();

   std::unique_ptr<MultiFab> scalarsCrse;
   if (level > 0) {
     auto& crselev = getLevel(level-1);
     scalarsCrse.reset(new MultiFab(crselev.boxArray(), crselev.DistributionMap(), nComp, 1));
     FillPatch(crselev, *scalarsCrse, 1, time, State_Type, Density, nComp, 0);
   }

   //
   // Compute/adjust species fluxes/heat flux/conduction, save in class data
   FluxBoxes fb_diff;
   MultiFab **beta = fb_diff.define(this,NUM_SPECIES+1);    // Local transport coeff face-centroid container
   getDiffusivity(beta, time, first_spec, 0, NUM_SPECIES);  // species (rhoD)
   getDiffusivity(beta, time, Temp, NUM_SPECIES, 1);        // temperature (lambda)

   compute_differential_diffusion_fluxes(scalars, scalarsCrse.get(), flux, beta, dt, time, include_Wbar_terms);

   D.setVal(0.0);
   DD.setVal(0.0);

   // Compute "D":
   // D[0:NUM_SPECIES-1] = -Div( Fk )
   // D[ NUM_SPECIES+1 ] = Div( lambda Grad(T) )
   BCRec const* d_bcrec_spec = &(m_bcrec_scalars_d.dataPtr())[first_spec-Density];
   flux_divergenceRD(scalars,first_spec-Density,D,0,flux,0,NUM_SPECIES,d_bcrec_spec,-1.0,dt,1);
   BCRec const* d_bcrec_temp = &(m_bcrec_scalars_d.dataPtr())[Temp-Density];
   flux_divergenceRD(scalars,Temp-Density,D,NUM_SPECIES+1,flux,NUM_SPECIES+2,1,d_bcrec_temp,-1.0,dt);

   // Compute "DD":
   // DD = -Sum{ Div( hk . Fk ) } a.k.a. the "diffdiff" terms
   BCRec const* d_bcrec_rhoh = &(m_bcrec_scalars_d.dataPtr())[RhoH-Density];
   flux_divergenceRD(scalars,RhoH-Density,DD,0,flux,NUM_SPECIES+1,1,d_bcrec_rhoh,-1.0,dt);

   if (D.nGrow() > 0 && DD.nGrow() > 0)
   {
     const int nc = NUM_SPECIES+2;

     D.FillBoundary(0,nc, geom.periodicity());
     DD.FillBoundary(0,1, geom.periodicity());

     Extrapolater::FirstOrderExtrap(D, geom, 0, nc, D.nGrow());
     Extrapolater::FirstOrderExtrap(DD, geom, 0, 1, DD.nGrow());
   }
}